

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

wchar_t * __thiscall ON_wString::ReserveArray(ON_wString *this,size_t array_capacity)

{
  wchar_t *pwVar1;
  void *pvVar2;
  ON_Internal_Empty_wString *pOVar3;
  wchar_t *pwVar4;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t capacity;
  
  if (array_capacity == 0) {
    pwVar4 = (wchar_t *)0x0;
  }
  else if (array_capacity < 0xffffffff) {
    pwVar4 = this->m_s;
    pOVar3 = (ON_Internal_Empty_wString *)(pwVar4 + -3);
    capacity = (wchar_t)array_capacity;
    if (pOVar3 == &empty_wstring || pwVar4 == (wchar_t *)0x0) {
      CreateArray(this,capacity);
    }
    else if ((pOVar3->header).ref_count.super___atomic_base<int>._M_i < 2) {
      if (pwVar4[-1] < capacity) {
        pvVar2 = onrealloc(pOVar3,(long)(int)((long)capacity + 1) * 4 + 0xc);
        this->m_s = (wchar_t *)((long)pvVar2 + 0xc);
        memset((void *)((long)pvVar2 + (long)*(int *)((long)pvVar2 + 8) * 4 + 0xc),0,
               (((long)capacity + 1) - (long)*(int *)((long)pvVar2 + 8)) * 4);
        *(wchar_t *)((long)pvVar2 + 8) = capacity;
      }
    }
    else {
      this->m_s = (wchar_t *)0x8431fc;
      CreateArray(this,capacity);
      if (pwVar4[-2] < capacity) {
        capacity = pwVar4[-2];
      }
      if (L'\0' < capacity) {
        pOVar5 = (ON_Internal_Empty_wString *)(this->m_s + -3);
        if (this->m_s == (wchar_t *)0x0) {
          pOVar5 = &empty_wstring;
        }
        memcpy(&pOVar5->s,pwVar4,(ulong)(uint)capacity << 2);
        (pOVar5->header).string_length = capacity;
      }
      LOCK();
      (pOVar3->header).ref_count.super___atomic_base<int>._M_i =
           (pOVar3->header).ref_count.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pOVar3->header).ref_count.super___atomic_base<int>._M_i == 0) {
        pwVar4[-2] = L'\0';
        pwVar4[-1] = L'\0';
        onfree(pOVar3);
      }
    }
    CopyArray(this);
    pwVar1 = this->m_s;
    pOVar3 = (ON_Internal_Empty_wString *)(pwVar1 + -3);
    if (pwVar1 == (wchar_t *)0x0) {
      pOVar3 = &empty_wstring;
    }
    pwVar4 = (wchar_t *)0x0;
    if (0 < (pOVar3->header).string_capacity) {
      pwVar4 = pwVar1;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_wstring.cpp"
               ,0x1aa,"","Requested capacity > ON_wString::MaximumStringLength");
    pwVar4 = (wchar_t *)0x0;
  }
  return pwVar4;
}

Assistant:

wchar_t* ON_wString::ReserveArray( size_t array_capacity )
{
  if (array_capacity <= 0)
    return nullptr;

  if (array_capacity > (size_t)ON_wString::MaximumStringLength)
  {
    ON_ERROR("Requested capacity > ON_wString::MaximumStringLength");
    return nullptr;
  }

  const int capacity = (int)array_capacity; // for 64 bit compiler
  ON_wStringHeader* hdr0 = Header();
  if ( hdr0 == pEmptyStringHeader || nullptr == hdr0 )
  {
		CreateArray(capacity);
  }
  else if ( (int)(hdr0->ref_count) > 1 )
  {
    // Calling Create() here insures hdr0 remains valid until we decrement below.
    Create();

    // Allocate a new array
		CreateArray(capacity);
    ON_wStringHeader* hdr1 = Header();
    const int size = (capacity < hdr0->string_length) ? capacity : hdr0->string_length;
    if ( size > 0 )
    {
      memcpy( hdr1->string_array(), hdr0->string_array(), size*sizeof(*m_s) );
      hdr1->string_length = size;
    }
    // "this" no longer requires access to the original header
    // If we are in a multi-threaded situation and another thread
    // has decremented ref_count since the > 1 check above,
    // we might end up deleting hdr0.
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr0);
  }
	else if ( capacity > hdr0->string_capacity )
  {
		hdr0 = (ON_wStringHeader*)onrealloc( hdr0, sizeof(ON_wStringHeader) + (capacity+1)*sizeof(*m_s) );
    m_s = hdr0->string_array();
    memset( &m_s[hdr0->string_capacity], 0, (1 + capacity - hdr0->string_capacity)*sizeof(*m_s) );
    hdr0->string_capacity = capacity;
	}
  return Array();
}